

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O2

void __thiscall icu_63::Package::addFile(Package *this,char *filesPath,char *name)

{
  undefined8 in_RAX;
  uint8_t *data;
  char type;
  undefined8 uStack_28;
  int32_t length;
  
  uStack_28 = in_RAX;
  data = readFile(filesPath,name,&length,&type);
  addItem(this,name,data,length,'\x01',type);
  return;
}

Assistant:

void
Package::addFile(const char *filesPath, const char *name) {
    uint8_t *data;
    int32_t length;
    char type;

    data=readFile(filesPath, name, length, type);
    // readFile() exits the tool if it fails
    addItem(name, data, length, TRUE, type);
}